

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

int __thiscall ON_BinaryArchive::Read3dmLayer(ON_BinaryArchive *this,ON_Layer **ppLayer)

{
  bool bVar1;
  int iVar2;
  ON_Layer *this_00;
  ON__UINT32 tcode;
  ON_Object *p;
  ON_Layer *layer;
  ON__INT64 big_value;
  uint local_34;
  ON_Object *local_30;
  ON_Layer *local_28;
  ON__INT64 local_20;
  
  bVar1 = Read3dmTableRecord(this,layer_table,ppLayer);
  if (!bVar1) {
    return 0;
  }
  local_28 = (ON_Layer *)0x0;
  if (this->m_3dm_version == 1) {
    bVar1 = Read3dmV1Layer(this,&local_28);
    this_00 = local_28;
    if (local_28 == (ON_Layer *)0x0 || !bVar1) {
LAB_003d02f7:
      if (this_00 == (ON_Layer *)0x0) goto LAB_003d030d;
    }
    else {
      Internal_Read3dmUpdateManifest(this,&local_28->super_ON_ModelComponent);
    }
    ON_Layer::HasPerViewportSettings(this_00,&ON_nil_uuid);
  }
  else {
    local_34 = 0;
    local_20 = 0;
    bVar1 = BeginRead3dmBigChunk(this,&local_34,&local_20);
    if (bVar1) {
      if (local_34 == 0xffffffff) {
        this_00 = (ON_Layer *)0x0;
      }
      else {
        if (local_34 == 0x20008050) {
          Internal_Increment3dmTableItemCount(this);
          local_30 = (ON_Object *)0x0;
          iVar2 = ReadObject(this,&local_30);
          if (iVar2 != 0) {
            this_00 = ON_Layer::Cast(local_30);
            local_28 = this_00;
            if (this_00 != (ON_Layer *)0x0) {
              Internal_Read3dmUpdateManifest(this,&this_00->super_ON_ModelComponent);
              goto LAB_003d02ef;
            }
            if (local_30 != (ON_Object *)0x0) {
              (*local_30->_vptr_ON_Object[4])();
            }
          }
          iVar2 = 0x2864;
        }
        else {
          iVar2 = 0x2868;
        }
        this_00 = (ON_Layer *)0x0;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,iVar2,"","ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
      }
LAB_003d02ef:
      EndRead3dmChunk(this);
      goto LAB_003d02f7;
    }
LAB_003d030d:
    this_00 = (ON_Layer *)0x0;
  }
  *ppLayer = this_00;
  return (uint)(this_00 != (ON_Layer *)0x0);
}

Assistant:

int ON_BinaryArchive::Read3dmLayer( ON_Layer** ppLayer )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::layer_table, (void**)ppLayer))
    return 0;

  ON__UINT32 tcode;
  ON__INT64 big_value;
  ON_Layer* layer = nullptr;
  // returns 0 at end of layer table
  if ( m_3dm_version == 1 )
  {
    if (Read3dmV1Layer(layer) && nullptr != layer)
      Internal_Read3dmUpdateManifest(*layer);
  }
  else 
  {
    // version 2+
    tcode = 0;
    big_value = 0;
    if ( BeginRead3dmBigChunk( &tcode, &big_value ) )
    {
      if ( tcode == TCODE_LAYER_RECORD )
      {
        Internal_Increment3dmTableItemCount();
        ON_Object* p = 0;
        if ( ReadObject( &p ) )
        {
          layer = ON_Layer::Cast(p);
          if ( nullptr == layer )
            delete p;
          else
          {
            Internal_Read3dmUpdateManifest(*layer);
          }
        }
        if (nullptr == layer) {
          ON_ERROR("ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
        }
      }
      else if ( tcode != TCODE_ENDOFTABLE ) {
        ON_ERROR("ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
      }
      EndRead3dmChunk();
    }
  }
  if ( layer )
    layer->HasPerViewportSettings(ON_nil_uuid); // this call sets ON_Layer::m__runtime_flags
  *ppLayer = layer;
  return (layer) ? 1 : 0;
}